

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  uint uVar1;
  byte bVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint factor;
  ulong uVar7;
  int shift_amount;
  bool bVar8;
  
  if ((int)CONCAT62(in_register_00000032,base) == 0) {
    __assert_fail("base != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x19d,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
  }
  if (power_exponent < 0) {
    __assert_fail("power_exponent >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x19e,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
  }
  if (power_exponent == 0) {
    AssignUInt16(this,1);
    return;
  }
  uVar3 = CONCAT62(in_register_00000032,base) & 0xffffffff;
  Zero(this);
  shift_amount = 0;
  while( true ) {
    uVar7 = uVar3 & 0xffff;
    factor = (uint)uVar7;
    if ((uVar3 & 1) != 0) break;
    uVar3 = (ulong)(factor >> 1);
    shift_amount = shift_amount + power_exponent;
  }
  bVar2 = 0;
  uVar1 = 0;
  for (uVar3 = uVar7; (uint)uVar3 != 0; uVar3 = (ulong)((uint)uVar3 >> 1)) {
    bVar2 = bVar2 - 1;
    uVar1 = uVar1 + power_exponent;
  }
  if (uVar1 < 0xde4) {
    uVar1 = 1;
    do {
      uVar5 = uVar1;
      uVar1 = uVar5 * 2;
    } while ((int)uVar5 <= power_exponent);
    uVar5 = uVar5 >> 2;
    bVar6 = false;
    uVar3 = uVar7;
    while ((uVar5 != 0 && (uVar3 >> 0x20 == 0))) {
      uVar3 = uVar3 * uVar3;
      if ((uVar5 & power_exponent) != 0) {
        bVar8 = uVar3 >> (bVar2 & 0x3f) != 0;
        uVar4 = 1;
        if (!bVar8) {
          uVar4 = uVar7;
        }
        uVar3 = uVar3 * uVar4;
        bVar6 = (bool)(bVar6 | bVar8);
      }
      uVar5 = uVar5 >> 1;
    }
    AssignUInt64(this,uVar3);
    if (bVar6) {
      MultiplyByUInt32(this,factor);
    }
    for (; uVar5 != 0; uVar5 = uVar5 >> 1) {
      Square(this);
      if ((uVar5 & power_exponent) != 0) {
        MultiplyByUInt32(this,factor);
      }
    }
    ShiftLeft(this,shift_amount);
    return;
  }
  abort();
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, int power_exponent) {
  ASSERT(base != 0);
  ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multipliciation = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      uint64_t base_bits_mask =
          ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multipliciation = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multipliciation) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}